

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGeoMeshBuilder.cpp
# Opt level: O2

TPZGeoEl *
TPZGeoMeshBuilder::InsertElement
          (TPZGeoMesh *gmesh,int *physical_identifier,int *el_type,int *el_identifier,
          vector<int,_std::allocator<int>_> *node_identifiers)

{
  pointer piVar1;
  TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *this;
  ostream *poVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long local_d0;
  TPZManVector<long,_15> Topology;
  
  uVar4 = 0;
  TPZManVector<long,_15>::TPZManVector(&Topology,0);
  uVar6 = (ulong)((long)(node_identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(node_identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  iVar5 = (int)uVar6;
  local_d0 = 0;
  TPZManVector<long,_15>::Resize(&Topology,(long)iVar5,&local_d0);
  piVar1 = (node_identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = uVar6 & 0xffffffff;
  if (iVar5 < 1) {
    uVar6 = uVar4;
  }
  for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    Topology.super_TPZVec<long>.fStore[uVar4] = (long)piVar1[uVar4] + -1;
  }
  iVar5 = *el_identifier;
  iVar3 = (int)((long)iVar5 + -1);
  *el_identifier = iVar3;
  switch(*el_type) {
  case 1:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(200);
    TPZGeoElRefPattern<pzgeom::TPZGeoLinear>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZGeoLinear> *)this,(long)iVar5 + -1,
               &Topology.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 2:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x130);
    TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZGeoTriangle> *)this,(long)iVar3,
               &Topology.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 3:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x168);
    TPZGeoElRefPattern<pzgeom::TPZGeoQuad>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZGeoQuad> *)this,(long)iVar3,
               &Topology.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 4:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x1f8);
    TPZGeoElRefPattern<pzgeom::TPZGeoTetrahedra>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZGeoTetrahedra> *)this,(long)iVar3,
               &Topology.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 5:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x338);
    TPZGeoElRefPattern<pzgeom::TPZGeoCube>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)this,(long)iVar3,
               &Topology.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 6:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x298);
    TPZGeoElRefPattern<pzgeom::TPZGeoPrism>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZGeoPrism> *)this,(long)iVar3,
               &Topology.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 7:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x260);
    TPZGeoElRefPattern<pzgeom::TPZGeoPyramid>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZGeoPyramid> *)this,(long)iVar3,
               &Topology.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 8:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0xd0);
    TPZGeoElRefPattern<pzgeom::TPZQuadraticLine>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZQuadraticLine> *)this,(long)iVar3,
               &Topology.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 9:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x148);
    TPZGeoElRefPattern<pzgeom::TPZQuadraticTrig>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZQuadraticTrig> *)this,(long)iVar3,
               &Topology.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 10:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x188);
    TPZGeoElRefPattern<pzgeom::TPZQuadraticQuad>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZQuadraticQuad> *)this,(long)iVar3,
               &Topology.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 0xb:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x228);
    TPZGeoElRefPattern<pzgeom::TPZQuadraticTetra>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZQuadraticTetra> *)this,(long)iVar3,
               &Topology.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 0xc:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x398);
    TPZGeoElRefPattern<pzgeom::TPZQuadraticCube>::TPZGeoElRefPattern
              (this,(long)iVar3,&Topology.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 0xd:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x2e0);
    TPZGeoElRefPattern<pzgeom::TPZQuadraticPrism>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZQuadraticPrism> *)this,(long)iVar3,
               &Topology.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  default:
    poVar2 = std::operator<<((ostream *)&std::cout,"Element not impelemented.");
    std::endl<char,std::char_traits<char>>(poVar2);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZGeoMeshBuilder.cpp"
               ,0x8a);
  case 0xf:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x70);
    TPZGeoElement<pzgeom::TPZGeoPoint,_pzrefine::TPZRefPoint>::TPZGeoElement
              ((TPZGeoElement<pzgeom::TPZGeoPoint,_pzrefine::TPZRefPoint> *)this,(long)iVar3,
               &Topology.super_TPZVec<long>,*physical_identifier,gmesh);
  }
  TPZManVector<long,_15>::~TPZManVector(&Topology);
  return (TPZGeoEl *)this;
}

Assistant:

TPZGeoEl* TPZGeoMeshBuilder::InsertElement(TPZGeoMesh * gmesh, int & physical_identifier, int & el_type, int & el_identifier, std::vector<int> & node_identifiers){
    
    TPZManVector <int64_t,15> Topology;
    int n_nodes = node_identifiers.size();
    Topology.Resize(n_nodes, 0);
    for (int k_node = 0; k_node<n_nodes; k_node++) {
        Topology[k_node] = node_identifiers[k_node]-1;
    }
    TPZGeoEl* gel = nullptr;
    el_identifier--;
    switch (el_type) {
        case 1:
        {   // Line
            gel = new TPZGeoElRefPattern< pzgeom::TPZGeoLinear> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 2:
        {
            // Triangle
            gel = new TPZGeoElRefPattern< pzgeom::TPZGeoTriangle> (el_identifier, Topology, physical_identifier, *gmesh);
            
        }
            break;
        case 3:
        {
            // Quadrilateral
            gel = new TPZGeoElRefPattern< pzgeom::TPZGeoQuad> (el_identifier, Topology, physical_identifier, *gmesh);
            
        }
            break;
        case 4:
        {
            // Tetrahedron
            gel = new TPZGeoElRefPattern< pzgeom::TPZGeoTetrahedra> (el_identifier, Topology, physical_identifier, *gmesh);
            
        }
            break;
        case 5:
        {
            // Hexahedra
            gel = new TPZGeoElRefPattern< pzgeom::TPZGeoCube> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 6:
        {
            // Prism
            gel = new TPZGeoElRefPattern< pzgeom::TPZGeoPrism> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 7:
        {
            // Pyramid
            gel = new TPZGeoElRefPattern< pzgeom::TPZGeoPyramid> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 8:
        {
            // Quadratic Line
            gel = new TPZGeoElRefPattern< pzgeom::TPZQuadraticLine> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 9:
        {
            // Triangle
            gel = new TPZGeoElRefPattern< pzgeom::TPZQuadraticTrig> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 10:
        {
            // Quadrilateral
            gel = new TPZGeoElRefPattern< pzgeom::TPZQuadraticQuad> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 11:
        {
            // Tetrahedron
            gel = new TPZGeoElRefPattern< pzgeom::TPZQuadraticTetra> (el_identifier, Topology, physical_identifier, *gmesh);
            
        }
            break;
        case 12:
        {
            // Hexahedra
            gel = new TPZGeoElRefPattern< pzgeom::TPZQuadraticCube> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 13:
        {
            // Prism
            gel = new TPZGeoElRefPattern< pzgeom::TPZQuadraticPrism> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 15:{
            // Point
            gel = new TPZGeoElement< pzgeom::TPZGeoPoint, pzrefine::TPZRefPoint> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        default:
        {
            std::cout << "Element not impelemented." << std::endl;
            DebugStop();
        }
            break;
    }
    return gel;
}